

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

size_t ByteStreamToBase32(uint8_t *inBuf,size_t len,char *outBuf,size_t outLen)

{
  uint uVar1;
  char local_44;
  bool local_3e;
  int ind;
  int tmp;
  int bits;
  size_t pos;
  size_t ret;
  size_t outLen_local;
  char *outBuf_local;
  size_t len_local;
  uint8_t *inBuf_local;
  
  ret = 0;
  pos = 1;
  bits = 8;
  tmp = (int)*inBuf;
  while( true ) {
    local_3e = false;
    if (ret < outLen) {
      local_3e = 0 < bits || pos < len;
    }
    if (!local_3e) break;
    if (bits < 5) {
      if (pos < len) {
        tmp = (uint)inBuf[pos] | tmp << 8;
        pos = pos + 1;
        bits = bits + 8;
      }
      else {
        tmp = tmp << (5U - (char)bits & 0x1f);
        bits = 5;
      }
    }
    bits = bits + -5;
    uVar1 = tmp >> ((byte)bits & 0x1f) & 0x1f;
    local_44 = (char)uVar1;
    if (uVar1 < 0x1a) {
      local_44 = local_44 + 'a';
    }
    else {
      local_44 = local_44 + '\x18';
    }
    outBuf[ret] = local_44;
    ret = ret + 1;
  }
  return ret;
}

Assistant:

size_t ByteStreamToBase32 (const uint8_t * inBuf, size_t len, char * outBuf, size_t outLen)
	{
		size_t ret = 0, pos = 1;
		int bits = 8, tmp = inBuf[0];
		while (ret < outLen && (bits > 0 || pos < len))
		{
			if (bits < 5)
			{
				if (pos < len)
				{
					tmp <<= 8;
					tmp |= inBuf[pos] & 0xFF;
					pos++;
					bits += 8;
				}
				else // last byte
				{
					tmp <<= (5 - bits);
					bits = 5;
				}
			}

			bits -= 5;
			int ind = (tmp >> bits) & 0x1F;
			outBuf[ret] = (ind < 26) ? (ind + 'a') : ((ind - 26) + '2');
			ret++;
		}
		return ret;
	}